

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int eventSetFunc(uint event,eventFunc_t f)

{
  FILE *__stream;
  char *pcVar1;
  ulong in_RSI;
  uint in_EDI;
  uint unaff_retaddr;
  FILE *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    in_stack_ffffffffffffffe8 = _stderr;
    pcVar1 = myTimeStamp();
    fprintf(in_stack_ffffffffffffffe8,"%s %s: event=%d function=%08X\n",pcVar1,"eventSetFunc",
            (ulong)in_EDI,in_RSI & 0xffffffff);
  }
  __stream = _stderr;
  if (libInitialised == 0) {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(__stream,"%s %s: pigpio uninitialised, call gpioInitialise()\n",pcVar1,"eventSetFunc")
      ;
    }
    iVar2 = -0x1f;
  }
  else if (in_EDI < 0x20) {
    intEventSetFunc(unaff_retaddr,(void *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                    (int)(in_RSI >> 0x20),in_stack_ffffffffffffffe8);
    iVar2 = 0;
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar1 = myTimeStamp();
      fprintf(__stream,"%s %s: bad event (%d)\n",pcVar1,"eventSetFunc",(ulong)in_EDI);
    }
    iVar2 = -0x8f;
  }
  return iVar2;
}

Assistant:

int eventSetFunc(unsigned event, eventFunc_t f)
{
   DBG(DBG_USER, "event=%d function=%08X", event, (uint32_t)f);

   CHECK_INITED;

   if (event > PI_MAX_EVENT)
      SOFT_ERROR(PI_BAD_EVENT_ID, "bad event (%d)", event);

   intEventSetFunc(event, f, 0, NULL);

   return 0;
}